

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O2

void __thiscall Assimp::Discreet3DSImporter::ParseLightChunk(Discreet3DSImporter *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  StreamReader<false,_false> *this_00;
  aiLight *paVar3;
  uint _limit;
  float fVar4;
  float fVar5;
  Chunk chunk;
  Chunk local_2e;
  
  do {
    do {
      if ((uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current) < 6) {
        return;
      }
      ReadChunk(this,&local_2e);
    } while ((int)(local_2e.Size - 6) < 1);
    this_00 = this->stream;
    _limit = StreamReader<false,_false>::SetReadLimit
                       (this_00,(local_2e.Size - 6) +
                                (*(int *)&this_00->current - *(int *)&this_00->buffer));
    paVar3 = (this->mScene->mLights).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
    if ((local_2e.Flag == 0x10) || (local_2e.Flag == 0x13)) {
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      (paVar3->mColorDiffuse).r = fVar4 * (paVar3->mColorDiffuse).r;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      (paVar3->mColorDiffuse).g = fVar4 * (paVar3->mColorDiffuse).g;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      (paVar3->mColorDiffuse).b = fVar4 * (paVar3->mColorDiffuse).b;
    }
    else if (local_2e.Flag == 0x465b) {
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      uVar1 = (paVar3->mColorDiffuse).r;
      uVar2 = (paVar3->mColorDiffuse).g;
      (paVar3->mColorDiffuse).r = fVar4 * (float)uVar1;
      (paVar3->mColorDiffuse).g = fVar4 * (float)uVar2;
      (paVar3->mColorDiffuse).b = (paVar3->mColorDiffuse).b * fVar4;
    }
    else if (local_2e.Flag == 0x4625) {
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      paVar3->mAttenuationLinear = fVar4;
    }
    else if (local_2e.Flag == 0x4610) {
      paVar3->mType = aiLightSource_SPOT;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      (paVar3->mDirection).x = fVar4 - (paVar3->mPosition).x;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      (paVar3->mDirection).y = fVar4 - (paVar3->mPosition).y;
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      (paVar3->mDirection).z = fVar4 - (paVar3->mPosition).z;
      aiVector3t<float>::Normalize(&paVar3->mDirection);
      fVar4 = StreamReader<false,_false>::Get<float>(this->stream);
      paVar3->mAngleInnerCone = fVar4 * 0.017453292;
      fVar5 = StreamReader<false,_false>::Get<float>(this->stream);
      paVar3->mAngleOuterCone = fVar5 * 0.017453292 + fVar4 * 0.017453292;
    }
    this->stream->current = this->stream->limit;
    StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
  } while (*(int *)&this->stream->limit != *(int *)&this->stream->current);
  return;
}

Assistant:

void Discreet3DSImporter::ParseLightChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();
    aiLight* light = mScene->mLights.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_DL_SPOTLIGHT:
        // Now we can be sure that the light is a spot light
        light->mType = aiLightSource_SPOT;

        // We wouldn't need to normalize here, but we do it
        light->mDirection.x = stream->GetF4() - light->mPosition.x;
        light->mDirection.y = stream->GetF4() - light->mPosition.y;
        light->mDirection.z = stream->GetF4() - light->mPosition.z;
        light->mDirection.Normalize();

        // Now the hotspot and falloff angles - in degrees
        light->mAngleInnerCone = AI_DEG_TO_RAD( stream->GetF4() );

        // FIX: the falloff angle is just an offset
        light->mAngleOuterCone = light->mAngleInnerCone+AI_DEG_TO_RAD( stream->GetF4() );
        break;

        // intensity multiplier
    case Discreet3DS::CHUNK_DL_MULTIPLIER:
        light->mColorDiffuse = light->mColorDiffuse * stream->GetF4();
        break;

        // light color
    case Discreet3DS::CHUNK_RGBF:
    case Discreet3DS::CHUNK_LINRGBF:
        light->mColorDiffuse.r *= stream->GetF4();
        light->mColorDiffuse.g *= stream->GetF4();
        light->mColorDiffuse.b *= stream->GetF4();
        break;

        // light attenuation
    case Discreet3DS::CHUNK_DL_ATTENUATE:
        light->mAttenuationLinear = stream->GetF4();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}